

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

void __thiscall
cs_impl::any::
holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~holder
          (holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  baseHolder *in_RDI;
  
  in_RDI->_vptr_baseHolder = (_func_int **)&PTR__holder_006c3970;
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  baseHolder::~baseHolder(in_RDI);
  return;
}

Assistant:

~ holder() override = default;